

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeCols(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxColId *id,int n,int *perm)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  DataKey *k;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  int *local_40;
  undefined8 local_38;
  
  auVar3 = _DAT_005f4040;
  auVar2 = _DAT_005f4030;
  auVar1 = _DAT_005f4020;
  if (perm == (int *)0x0) {
    iVar4 = (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    local_40 = (int *)0x0;
    local_38 = 0x3ff3333333333333;
    iVar5 = 0;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    iVar10 = 1;
    if (0 < iVar4) {
      iVar10 = iVar5;
    }
    spx_alloc<int*>(&local_40,iVar10);
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x18])(this,id,(ulong)(uint)n,local_40);
    if (local_40 != (int *)0x0) {
      free(local_40);
    }
    return;
  }
  iVar4 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  lVar6 = (long)iVar4;
  if (0 < lVar6) {
    lVar7 = lVar6 + -1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar9 = auVar9 ^ _DAT_005f4040;
    lVar8 = 0;
    do {
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar12 = (auVar11 | auVar2) ^ auVar3;
      iVar10 = auVar9._4_4_;
      iVar5 = (int)lVar7;
      if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ || iVar10 < auVar12._4_4_
                  ) & 1)) {
        perm[lVar6 + lVar7 + -1] = iVar4 + -1 + iVar5;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        perm[lVar6 + lVar7 + -2] = iVar4 + -2 + iVar5;
      }
      auVar11 = (auVar11 | auVar1) ^ auVar3;
      iVar13 = auVar11._4_4_;
      if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
        perm[lVar6 + lVar7 + -3] = iVar4 + -3 + iVar5;
        perm[lVar6 + lVar7 + -4] = iVar4 + -4 + iVar5;
      }
      lVar8 = lVar8 + 4;
      lVar7 = lVar7 + -4;
    } while (-lVar7 != (ulong)(iVar4 + 3U & 0xfffffffc));
  }
  if (n != 0) {
    lVar6 = (long)n;
    k = &id[lVar6].super_DataKey;
    do {
      k = k + -1;
      iVar4 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              ::number(&(this->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set,k);
      perm[iVar4] = -1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x17])(this,perm);
  return;
}

Assistant:

virtual void removeCols(SPxColId id[], int n, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         DataArray < int > p(nCols());
         removeCols(id, n, p.get_ptr());
         return;
      }

      for(int i = nCols() - 1; i >= 0; --i)
         perm[i] = i;

      while(n--)
         perm[number(id[n])] = -1;

      removeCols(perm);
   }